

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::setValue<bool>
          (TypedConfigurations *this,Level level,bool *value,
          map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          *confMap,bool includeGlobalLevel)

{
  byte bVar1;
  map<el::Level,bool,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>> *pmVar2;
  bool bVar3;
  bool bVar4;
  pointer ppVar5;
  pair<el::Level,_bool> pVar6;
  mapped_type *pmVar7;
  pair<el::Level,_bool> local_78;
  _Self local_70;
  _Base_ptr local_68;
  _Self local_60;
  key_type local_54;
  _Self local_50;
  iterator it;
  Level local_38;
  pair<el::Level,_bool> local_34;
  byte local_29;
  map<el::Level,bool,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
  *pmStack_28;
  bool includeGlobalLevel_local;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *confMap_local;
  bool *value_local;
  TypedConfigurations *pTStack_10;
  Level level_local;
  TypedConfigurations *this_local;
  
  local_29 = includeGlobalLevel;
  pmStack_28 = (map<el::Level,bool,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
                *)confMap;
  confMap_local =
       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
        *)value;
  value_local._4_4_ = level;
  pTStack_10 = this;
  bVar3 = utils::std::
          map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          ::empty(confMap);
  pmVar2 = pmStack_28;
  if ((bVar3) && ((local_29 & 1) != 0)) {
    local_38 = Global;
    pVar6 = std::make_pair<el::Level,bool_const&>(&local_38,(bool *)confMap_local);
    local_34.first = pVar6.first;
    local_34.second = pVar6.second;
    std::map<el::Level,bool,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>::
    insert<std::pair<el::Level,bool>>(pmVar2,&local_34);
  }
  else {
    local_54 = Global;
    local_50._M_node =
         (_Base_ptr)
         utils::std::
         map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
         ::find((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                 *)pmStack_28,&local_54);
    local_60._M_node =
         (_Base_ptr)
         utils::std::
         map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
         ::end((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                *)pmStack_28);
    bVar4 = utils::std::operator!=(&local_50,&local_60);
    bVar3 = false;
    if (bVar4) {
      ppVar5 = utils::std::_Rb_tree_iterator<std::pair<const_el::Level,_bool>_>::operator->
                         (&local_50);
      bVar3 = (ppVar5->second & 1U) == (*(byte *)&(confMap_local->_M_t)._M_impl & 1);
    }
    if (!bVar3) {
      local_68 = (_Base_ptr)
                 utils::std::
                 map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                 ::find((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                         *)pmStack_28,(key_type *)((long)&value_local + 4));
      local_50._M_node = local_68;
      local_70._M_node =
           (_Base_ptr)
           utils::std::
           map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
           ::end((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                  *)pmStack_28);
      bVar3 = utils::std::operator==(&local_50,&local_70);
      pmVar2 = pmStack_28;
      if (bVar3) {
        pVar6 = std::make_pair<el::Level&,bool_const&>
                          ((Level *)((long)&value_local + 4),(bool *)confMap_local);
        local_78.first = pVar6.first;
        local_78.second = pVar6.second;
        std::
        map<el::Level,bool,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>::
        insert<std::pair<el::Level,bool>>(pmVar2,&local_78);
      }
      else {
        bVar1 = *(byte *)&(confMap_local->_M_t)._M_impl;
        pmVar7 = utils::std::
                 map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                 ::at((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                       *)pmStack_28,(key_type *)((long)&value_local + 4));
        *pmVar7 = (mapped_type)(bVar1 & 1);
      }
    }
  }
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }